

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O1

Quadratic * parseOptions(Quadratic *__return_storage_ptr__,HighsLp *lp,ICrashOptions *options)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this;
  HighsLp ilp;
  HighsLp local_lp;
  ICrashOptions IStack_b68;
  HighsLp local_ae0;
  HighsLp local_748;
  HighsLp local_3b0;
  
  HighsLp::HighsLp(&local_ae0,lp);
  HighsLp::HighsLp(&local_3b0);
  convertToMinimization(&local_ae0);
  isEqualityProblem(&local_ae0);
  HighsLp::HighsLp(&local_748,&local_ae0);
  IStack_b68.dualize = options->dualize;
  IStack_b68._1_3_ = *(undefined3 *)&options->field_0x1;
  IStack_b68.strategy = options->strategy;
  IStack_b68._18_8_ = *(undefined8 *)((long)&options->iterations + 2);
  this = &IStack_b68.log_options.user_callback;
  IStack_b68.iterations._0_2_ =
       (undefined2)((ulong)*(undefined8 *)((long)&options->starting_weight + 2) >> 0x30);
  IStack_b68.starting_weight._0_2_ = SUB82(options->starting_weight,0);
  IStack_b68.starting_weight._2_6_ = (undefined6)((ulong)options->starting_weight >> 0x10);
  IStack_b68.log_options.log_stream = (options->log_options).log_stream;
  IStack_b68.log_options.output_flag = (options->log_options).output_flag;
  IStack_b68.log_options.log_to_console = (options->log_options).log_to_console;
  IStack_b68.log_options.log_dev_level = (options->log_options).log_dev_level;
  IStack_b68.log_options.user_log_callback = (options->log_options).user_log_callback;
  IStack_b68.log_options.user_log_callback_data = (options->log_options).user_log_callback_data;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this,&(options->log_options).user_callback);
  IStack_b68.log_options.user_callback_active = (options->log_options).user_callback_active;
  IStack_b68.log_options.user_callback_data = (options->log_options).user_callback_data;
  Quadratic::Quadratic(__return_storage_ptr__,&local_748,&IStack_b68);
  if (IStack_b68.log_options.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*IStack_b68.log_options.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  HighsLp::~HighsLp(&local_748);
  HighsLp::~HighsLp(&local_3b0);
  HighsLp::~HighsLp(&local_ae0);
  return __return_storage_ptr__;
}

Assistant:

Quadratic parseOptions(const HighsLp& lp, const ICrashOptions options) {
  HighsLp ilp = lp;
  HighsLp local_lp;
  // HighsStatus status;
  convertToMinimization(ilp);
  if (isEqualityProblem(ilp)) {
    if (options.dualize) {
      // status = dualizeEqualityProblem(ilp, local_lp);
      // if (status == HighsStatus::kOk) {
      //   ilp = local_lp;
      // } else {
      //   printf("Cannot dualize equality problem\n");
      // }
    }
  } else {
    // not equality problem.
    // assert(!options.breakpoints);  // remove when implementing breakpoints
    // and
    //                                // add if else.
    // status = transformIntoEqualityProblem(ilp, local_lp);
    // if (status == HighsStatus::kOk) {
    //   ilp = local_lp;
    // } else {
    //   printf("Cannot transform into equality problem\n");
    // }
    // if (options.dualize) {
    //   // Add slacks & dualize.
    //   // dualizeEqualityProblem returns a minimization equality problem.
    //   // status = dualizeEqualityProblem(ilp, local_lp);
    //   // if (status == HighsStatus::kOk) {
    //   //   ilp = local_lp;
    //   // } else {
    //   //   printf("Cannot dualize equality problem\n");
    //   // }
    // }
  }

  return Quadratic{ilp, options};
}